

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Vec_Str_t * Scl_LibertyReadGenlibStr(Scl_Tree_t *p,int fVerbose)

{
  int iVar1;
  Vec_Str_t *p_00;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  char *pFormula;
  Scl_Item_t *pInput;
  Scl_Item_t *pOutput;
  Scl_Item_t *pCell;
  Vec_Str_t *vStr;
  int fVerbose_local;
  Scl_Tree_t *p_local;
  
  p_00 = Vec_StrAlloc(1000);
  Vec_StrPrintStr(p_00,"GATE          _const0_  0.000000  z=CONST0;\n");
  Vec_StrPrintStr(p_00,"GATE          _const1_  0.000000  z=CONST1;\n");
  pSVar2 = Scl_LibertyRoot(p);
  pOutput = Scl_LibertyItem(p,pSVar2->Child);
  do {
    if (pOutput == (Scl_Item_t *)0x0) {
      Vec_StrPrintStr(p_00,"\n.end\n");
      Vec_StrPush(p_00,'\0');
      return p_00;
    }
    iVar1 = Scl_LibertyCompare(p,pOutput->Key,"cell");
    if (iVar1 == 0) {
      iVar1 = Scl_LibertyReadCellIsFlop(p,pOutput);
      if (iVar1 == 0) {
        iVar1 = Scl_LibertyReadCellIsThreeState(p,pOutput);
        if (iVar1 == 0) {
          iVar1 = Scl_LibertyReadCellOutputNum(p,pOutput);
          if (iVar1 == 0) {
            if (fVerbose != 0) {
              pcVar3 = Scl_LibertyReadString(p,pOutput->Head);
              printf("Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n",pcVar3)
              ;
            }
          }
          else {
            for (pInput = Scl_LibertyItem(p,pOutput->Child); pInput != (Scl_Item_t *)0x0;
                pInput = Scl_LibertyItem(p,pInput->Next)) {
              iVar1 = Scl_LibertyCompare(p,pInput->Key,"pin");
              if ((iVar1 == 0) &&
                 (pcVar3 = Scl_LibertyReadPinFormula(p,pInput), pcVar3 == (char *)0x0)) {
                iVar1 = strcmp((char *)0x0,"0");
                if ((iVar1 == 0) || (iVar1 = strcmp((char *)0x0,"1"), iVar1 == 0)) {
                  if (fVerbose != 0) {
                    pcVar3 = Scl_LibertyReadString(p,pOutput->Head);
                    printf("Scl_LibertyReadGenlib() skipped cell \"%s\" with constant formula \"%s\".\n"
                           ,pcVar3,0);
                  }
                  break;
                }
                Vec_StrPrintStr(p_00,"GATE ");
                pcVar3 = Scl_LibertyReadString(p,pOutput->Head);
                Vec_StrPrintStr(p_00,pcVar3);
                Vec_StrPrintStr(p_00," ");
                pcVar3 = Scl_LibertyReadCellArea(p,pOutput);
                Vec_StrPrintStr(p_00,pcVar3);
                Vec_StrPrintStr(p_00," ");
                pcVar3 = Scl_LibertyReadString(p,pInput->Head);
                Vec_StrPrintStr(p_00,pcVar3);
                Vec_StrPrintStr(p_00,"=");
                Vec_StrPrintStr(p_00,(char *)0x0);
                Vec_StrPrintStr(p_00,";\n");
                for (pFormula = (char *)Scl_LibertyItem(p,pOutput->Child); pFormula != (char *)0x0;
                    pFormula = (char *)Scl_LibertyItem(p,*(int *)(pFormula + 0x20))) {
                  iVar1 = Scl_LibertyCompare(p,*(Scl_Pair_t *)(pFormula + 8),"pin");
                  if ((iVar1 == 0) &&
                     (pcVar3 = Scl_LibertyReadPinFormula(p,(Scl_Item_t *)pFormula),
                     pcVar3 != (char *)0x0)) {
                    Vec_StrPrintStr(p_00,"  PIN ");
                    pcVar3 = Scl_LibertyReadString(p,*(Scl_Pair_t *)(pFormula + 0x10));
                    Vec_StrPrintStr(p_00,pcVar3);
                    Vec_StrPrintStr(p_00," UNKNOWN  1  999  1.00  0.00  1.00  0.00\n");
                  }
                }
              }
            }
          }
        }
        else if (fVerbose != 0) {
          pcVar3 = Scl_LibertyReadString(p,pOutput->Head);
          printf("Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n",pcVar3);
        }
      }
      else if (fVerbose != 0) {
        pcVar3 = Scl_LibertyReadString(p,pOutput->Head);
        printf("Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n",pcVar3);
      }
    }
    pOutput = Scl_LibertyItem(p,pOutput->Next);
  } while( true );
}

Assistant:

Vec_Str_t * Scl_LibertyReadGenlibStr( Scl_Tree_t * p, int fVerbose )
{
    Vec_Str_t * vStr;
    Scl_Item_t * pCell, * pOutput, * pInput;
    char * pFormula;
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE          _const0_  0.000000  z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE          _const1_  0.000000  z=CONST1;\n" );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        if ( Scl_LibertyReadCellOutputNum(p, pCell) == 0 )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        // iterate through output pins
        Scl_ItemForEachChildName( p, pCell, pOutput, "pin" )
        {
            if ( (pFormula = Scl_LibertyReadPinFormula(p, pOutput)) ) 
                continue;
            if ( !strcmp(pFormula, "0") || !strcmp(pFormula, "1") )
            {
                if ( fVerbose ) printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" with constant formula \"%s\".\n", Scl_LibertyReadString(p, pCell->Head), pFormula );
                break;
            }
            Vec_StrPrintStr( vStr, "GATE " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pCell->Head) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadCellArea(p, pCell) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pOutput->Head) );
            Vec_StrPrintStr( vStr, "=" );
            Vec_StrPrintStr( vStr, pFormula );
            Vec_StrPrintStr( vStr, ";\n" );
            // iterate through input pins
            Scl_ItemForEachChildName( p, pCell, pInput, "pin" )
            {
                if ( Scl_LibertyReadPinFormula(p, pInput) == NULL )
                    continue;
                Vec_StrPrintStr( vStr, "  PIN " );
                Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pInput->Head) );
                Vec_StrPrintStr( vStr, " UNKNOWN  1  999  1.00  0.00  1.00  0.00\n" );
            }
        }
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "%s", Vec_StrArray(vStr) );
    return vStr;
}